

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O0

void t3(void)

{
  int dc [4];
  int pw [3];
  int v;
  int t;
  float off;
  float on;
  int rr;
  int f;
  char *desc;
  undefined8 uVar1;
  int in_stack_ffffffffffffffd8;
  undefined8 uVar2;
  int t_00;
  int local_14;
  
  uVar2 = 0x5dc000001f4;
  t_00 = 0x9c4;
  desc = (char *)0x2800000014;
  uVar1 = 0x500000003c;
  printf("PWM/Servo pulse accuracy tests.\n");
  t3_val = 0x1167535;
  t3_reset = 1;
  t3_count = 0;
  t3_tick = 0;
  t3_on = 0.0;
  t3_off = 0.0;
  gpioSetAlertFuncEx(0x19,t3cbf,&t3_val);
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    gpioServo(0x19,*(undefined4 *)(&stack0xffffffffffffffdc + (long)local_14 * 4));
    gpioGetServoPulsewidth(0x19);
    CHECK(t_00,(int)((ulong)uVar2 >> 0x20),(int)uVar2,in_stack_ffffffffffffffd8,
          (int)((ulong)uVar1 >> 0x20),desc);
    time_sleep(0x3ff0000000000000);
    t3_reset = 1;
    time_sleep(0x4010000000000000);
    CHECK(t_00,(int)((ulong)uVar2 >> 0x20),(int)uVar2,in_stack_ffffffffffffffd8,
          (int)((ulong)uVar1 >> 0x20),desc);
  }
  gpioServo(0x19,0);
  gpioSetPWMfrequency(0x19,1000);
  gpioGetPWMfrequency(0x19);
  CHECK(t_00,(int)((ulong)uVar2 >> 0x20),(int)uVar2,in_stack_ffffffffffffffd8,
        (int)((ulong)uVar1 >> 0x20),desc);
  gpioSetPWMrange(0x19,100);
  CHECK(t_00,(int)((ulong)uVar2 >> 0x20),(int)uVar2,in_stack_ffffffffffffffd8,
        (int)((ulong)uVar1 >> 0x20),desc);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    gpioPWM(0x19,*(undefined4 *)(&stack0xffffffffffffffc8 + (long)local_14 * 4));
    gpioGetPWMdutycycle(0x19);
    CHECK(t_00,(int)((ulong)uVar2 >> 0x20),(int)uVar2,in_stack_ffffffffffffffd8,
          (int)((ulong)uVar1 >> 0x20),desc);
    time_sleep(0x3ff0000000000000);
    t3_reset = 1;
    time_sleep(0x4000000000000000);
    CHECK(t_00,(int)((ulong)uVar2 >> 0x20),(int)uVar2,in_stack_ffffffffffffffd8,
          (int)((ulong)uVar1 >> 0x20),desc);
  }
  gpioPWM(0x19,0);
  return;
}

Assistant:

void t3()
{
   int f, rr;

   float on, off;

   int t, v;

   int pw[3]={500, 1500, 2500};
   int dc[4]={20, 40, 60, 80};

   printf("PWM/Servo pulse accuracy tests.\n");

   t3_val = USERDATA;
   t3_reset=1;
   t3_count=0;
   t3_tick=0;
   t3_on=0.0;
   t3_off=0.0;

   gpioSetAlertFuncEx(GPIO, t3cbf, &t3_val); /* test extended alert */

   for (t=0; t<3; t++)
   {
      gpioServo(GPIO, pw[t]);
      v = gpioGetServoPulsewidth(GPIO);
      CHECK(3, t+t+1, v, pw[t], 0, "get servo pulsewidth");

      time_sleep(1);
      t3_reset = 1;
      time_sleep(4);
      on = t3_on;
      off = t3_off;
      CHECK(3, t+t+2, (1E3*(on+off))/on, 2E7/pw[t], 1,
          "set servo pulsewidth");
   }

   gpioServo(GPIO, 0);
   gpioSetPWMfrequency(GPIO, 1000);
   f = gpioGetPWMfrequency(GPIO);
   CHECK(3, 7, f, 1000, 0, "set/get PWM frequency");

   rr = gpioSetPWMrange(GPIO, 100);
   CHECK(3, 8, rr, 200, 0, "set PWM range");

   for (t=0; t<4; t++)
   {
      gpioPWM(GPIO, dc[t]);
      v = gpioGetPWMdutycycle(GPIO);
      CHECK(3, t+t+9, v, dc[t], 0, "get PWM dutycycle");

      time_sleep(1);
      t3_reset = 1;
      time_sleep(2);
      on = t3_on;
      off = t3_off;
      CHECK(3, t+t+10, (1E3*on)/(on+off), 1E1*dc[t], 1,
         "set PWM dutycycle");
   }

   gpioPWM(GPIO, 0);
}